

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ThreadSafeArena::CleanupList(ThreadSafeArena *this)

{
  bool bVar1;
  SerialArenaChunk *pSVar2;
  Nullable<const_char_*> failure_msg;
  SerialArenaChunk *this_00;
  long lVar3;
  Span<std::atomic<google::protobuf::internal::SerialArena_*>_> SVar4;
  SerialArena *serial;
  SerialArena *local_50;
  ThreadSafeArena *local_48;
  LogMessage local_40;
  
  this_00 = (this->head_)._M_b._M_p;
  local_48 = this;
  do {
    bVar1 = SerialArenaChunk::IsSentry(this_00);
    if (bVar1) {
      SerialArena::CleanupList(&local_48->first_arena_);
      return;
    }
    pSVar2 = SerialArenaChunk::next_chunk(this_00);
    SVar4 = SerialArenaChunk::arenas(this_00);
    for (lVar3 = SVar4.len_ << 3; this_00 = pSVar2, lVar3 != 0; lVar3 = lVar3 + -8) {
      local_50 = *(SerialArena **)((long)&SVar4.ptr_[-1]._M_b._M_p + lVar3);
      local_40.errno_saver_.saved_errno_ = 0;
      local_40._4_4_ = 0;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_NEImpl<google::protobuf::internal::SerialArena*,decltype(nullptr)>
                              (&local_50,(void **)&local_40,"serial != nullptr");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
                   ,0x3ae,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      SerialArena::CleanupList(local_50);
    }
  } while( true );
}

Assistant:

void ThreadSafeArena::CleanupList() {
  if constexpr (HasMemoryPoisoning()) {
    UnpoisonAllArenaBlocks();
  }

  WalkSerialArenaChunk([](SerialArenaChunk* chunk) {
    absl::Span<std::atomic<SerialArena*>> span = chunk->arenas();
    // Walks arenas backward to handle the first serial arena the last.
    // Destroying in reverse-order to the construction is often assumed by users
    // and required not to break inter-object dependencies. (b/247560530)
    for (auto it = span.rbegin(); it != span.rend(); ++it) {
      SerialArena* serial = it->load(std::memory_order_relaxed);
      ABSL_DCHECK_NE(serial, nullptr);
      serial->CleanupList();
    }
  });
  // First arena must be cleaned up last. (b/247560530)
  first_arena_.CleanupList();
}